

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknet2ncnn.cpp
# Opt level: O0

string * format<float>(char *fmt,float args)

{
  int iVar1;
  char *__s;
  char *in_RSI;
  string *in_RDI;
  float in_XMM0_Da;
  size_t size;
  string *buf;
  
  iVar1 = snprintf((char *)0x0,0,in_RSI,(double)in_XMM0_Da);
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::reserve((ulong)in_RDI);
  std::__cxx11::string::resize((ulong)in_RDI);
  __s = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
  snprintf(__s,(long)iVar1 + 1,in_RSI,(double)in_XMM0_Da);
  return in_RDI;
}

Assistant:

std::string format(const char* fmt, Args... args)
{
    size_t size = snprintf(nullptr, 0, fmt, args...);
    std::string buf;
    buf.reserve(size + 1);
    buf.resize(size);
    snprintf(&buf[0], size + 1, fmt, args...);
    return buf;
}